

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O1

void duckdb::RowOperations::HeapScatterVData
               (UnifiedVectorFormat *vdata,PhysicalType type,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  data_ptr_t pdVar4;
  unsigned_long *puVar5;
  int iVar6;
  undefined8 uVar7;
  idx_t iVar8;
  ulong uVar9;
  NotImplementedException *this;
  undefined7 in_register_00000031;
  idx_t iVar10;
  string local_50;
  
  iVar6 = (int)CONCAT71(in_register_00000031,type);
  local_50._M_dataplus._M_p = (pointer)parent_validity.ptr;
  switch(iVar6) {
  case 1:
  case 3:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          *key_locations[iVar10] = pdVar2[uVar9];
          key_locations[iVar10] = key_locations[iVar10] + 1;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      iVar10 = 0;
      do {
        iVar8 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *key_locations[iVar10] = pdVar2[uVar9];
        key_locations[iVar10] = key_locations[iVar10] + 1;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
        }
        iVar10 = iVar10 + 1;
      } while (ser_count != iVar10);
    }
    break;
  case 2:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          *key_locations[iVar10] = pdVar2[uVar9];
          key_locations[iVar10] = key_locations[iVar10] + 1;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      iVar10 = 0;
      do {
        iVar8 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *key_locations[iVar10] = pdVar2[uVar9];
        key_locations[iVar10] = key_locations[iVar10] + 1;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
        }
        iVar10 = iVar10 + 1;
      } while (ser_count != iVar10);
    }
    break;
  case 4:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          *(undefined2 *)key_locations[iVar10] = *(undefined2 *)(pdVar2 + uVar9 * 2);
          key_locations[iVar10] = key_locations[iVar10] + 2;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      iVar10 = 0;
      do {
        iVar8 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined2 *)key_locations[iVar10] = *(undefined2 *)(pdVar2 + uVar9 * 2);
        key_locations[iVar10] = key_locations[iVar10] + 2;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
        }
        iVar10 = iVar10 + 1;
      } while (ser_count != iVar10);
    }
    break;
  case 5:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          *(undefined2 *)key_locations[iVar10] = *(undefined2 *)(pdVar2 + uVar9 * 2);
          key_locations[iVar10] = key_locations[iVar10] + 2;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      iVar10 = 0;
      do {
        iVar8 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined2 *)key_locations[iVar10] = *(undefined2 *)(pdVar2 + uVar9 * 2);
        key_locations[iVar10] = key_locations[iVar10] + 2;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
        }
        iVar10 = iVar10 + 1;
      } while (ser_count != iVar10);
    }
    break;
  case 6:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar9 * 4);
          key_locations[iVar10] = key_locations[iVar10] + 4;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      iVar10 = 0;
      do {
        iVar8 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar9 * 4);
        key_locations[iVar10] = key_locations[iVar10] + 4;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
        }
        iVar10 = iVar10 + 1;
      } while (ser_count != iVar10);
    }
    break;
  case 7:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar9 * 4);
          key_locations[iVar10] = key_locations[iVar10] + 4;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      iVar10 = 0;
      do {
        iVar8 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar9 * 4);
        key_locations[iVar10] = key_locations[iVar10] + 4;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
        }
        iVar10 = iVar10 + 1;
      } while (ser_count != iVar10);
    }
    break;
  case 8:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar9 * 8);
          key_locations[iVar10] = key_locations[iVar10] + 8;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      iVar10 = 0;
      do {
        iVar8 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar9 * 8);
        key_locations[iVar10] = key_locations[iVar10] + 8;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
        }
        iVar10 = iVar10 + 1;
      } while (ser_count != iVar10);
    }
    break;
  case 9:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar9 * 8);
          key_locations[iVar10] = key_locations[iVar10] + 8;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      iVar10 = 0;
      do {
        iVar8 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar9 * 8);
        key_locations[iVar10] = key_locations[iVar10] + 8;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
        }
        iVar10 = iVar10 + 1;
      } while (ser_count != iVar10);
    }
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_015cf555_caseD_a:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"FIXME: Serialize to of constant type column to row-format","");
    NotImplementedException::NotImplementedException(this,&local_50);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xb:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar9 * 4);
          key_locations[iVar10] = key_locations[iVar10] + 4;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      iVar10 = 0;
      do {
        iVar8 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined4 *)key_locations[iVar10] = *(undefined4 *)(pdVar2 + uVar9 * 4);
        key_locations[iVar10] = key_locations[iVar10] + 4;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
        }
        iVar10 = iVar10 + 1;
      } while (ser_count != iVar10);
    }
    break;
  case 0xc:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar9 * 8);
          key_locations[iVar10] = key_locations[iVar10] + 8;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      iVar10 = 0;
      do {
        iVar8 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        *(undefined8 *)key_locations[iVar10] = *(undefined8 *)(pdVar2 + uVar9 * 8);
        key_locations[iVar10] = key_locations[iVar10] + 8;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
        }
        iVar10 = iVar10 + 1;
      } while (ser_count != iVar10);
    }
    break;
  case 0x15:
    pdVar2 = vdata->data;
    if (parent_validity.ptr == (NestedValidity *)0x0) {
      if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          pdVar4 = key_locations[iVar10];
          pdVar1 = pdVar2 + uVar9 * 0x10;
          uVar7 = *(undefined8 *)(pdVar1 + 8);
          *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
          *(undefined8 *)(pdVar4 + 8) = uVar7;
          key_locations[iVar10] = key_locations[iVar10] + 0x10;
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else if (ser_count != 0) {
      iVar10 = 0;
      do {
        iVar8 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)sel->sel_vector[iVar10];
        }
        uVar9 = iVar8 + offset;
        psVar3 = vdata->sel->sel_vector;
        if (psVar3 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar3[uVar9];
        }
        pdVar4 = key_locations[iVar10];
        pdVar1 = pdVar2 + uVar9 * 0x10;
        uVar7 = *(undefined8 *)(pdVar1 + 8);
        *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
        *(undefined8 *)(pdVar4 + 8) = uVar7;
        key_locations[iVar10] = key_locations[iVar10] + 0x10;
        puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)) {
          optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                    ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
          NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
        }
        iVar10 = iVar10 + 1;
      } while (ser_count != iVar10);
    }
    break;
  default:
    if (iVar6 == 0xcb) {
      pdVar2 = vdata->data;
      if (parent_validity.ptr == (NestedValidity *)0x0) {
        if (ser_count != 0) {
          iVar10 = 0;
          do {
            iVar8 = iVar10;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar8 = (idx_t)sel->sel_vector[iVar10];
            }
            uVar9 = iVar8 + offset;
            psVar3 = vdata->sel->sel_vector;
            if (psVar3 != (sel_t *)0x0) {
              uVar9 = (ulong)psVar3[uVar9];
            }
            pdVar4 = key_locations[iVar10];
            pdVar1 = pdVar2 + uVar9 * 0x10;
            uVar7 = *(undefined8 *)(pdVar1 + 8);
            *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
            *(undefined8 *)(pdVar4 + 8) = uVar7;
            key_locations[iVar10] = key_locations[iVar10] + 0x10;
            iVar10 = iVar10 + 1;
          } while (ser_count != iVar10);
        }
      }
      else if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          pdVar4 = key_locations[iVar10];
          pdVar1 = pdVar2 + uVar9 * 0x10;
          uVar7 = *(undefined8 *)(pdVar1 + 8);
          *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
          *(undefined8 *)(pdVar4 + 8) = uVar7;
          key_locations[iVar10] = key_locations[iVar10] + 0x10;
          puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0))
          {
            optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                      ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
            NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
          }
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
    else {
      if (iVar6 != 0xcc) goto switchD_015cf555_caseD_a;
      pdVar2 = vdata->data;
      if (parent_validity.ptr == (NestedValidity *)0x0) {
        if (ser_count != 0) {
          iVar10 = 0;
          do {
            iVar8 = iVar10;
            if (sel->sel_vector != (sel_t *)0x0) {
              iVar8 = (idx_t)sel->sel_vector[iVar10];
            }
            uVar9 = iVar8 + offset;
            psVar3 = vdata->sel->sel_vector;
            if (psVar3 != (sel_t *)0x0) {
              uVar9 = (ulong)psVar3[uVar9];
            }
            pdVar4 = key_locations[iVar10];
            pdVar1 = pdVar2 + uVar9 * 0x10;
            uVar7 = *(undefined8 *)(pdVar1 + 8);
            *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
            *(undefined8 *)(pdVar4 + 8) = uVar7;
            key_locations[iVar10] = key_locations[iVar10] + 0x10;
            iVar10 = iVar10 + 1;
          } while (ser_count != iVar10);
        }
      }
      else if (ser_count != 0) {
        iVar10 = 0;
        do {
          iVar8 = iVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            iVar8 = (idx_t)sel->sel_vector[iVar10];
          }
          uVar9 = iVar8 + offset;
          psVar3 = vdata->sel->sel_vector;
          if (psVar3 != (sel_t *)0x0) {
            uVar9 = (ulong)psVar3[uVar9];
          }
          pdVar4 = key_locations[iVar10];
          pdVar1 = pdVar2 + uVar9 * 0x10;
          uVar7 = *(undefined8 *)(pdVar1 + 8);
          *(undefined8 *)pdVar4 = *(undefined8 *)pdVar1;
          *(undefined8 *)(pdVar4 + 8) = uVar7;
          key_locations[iVar10] = key_locations[iVar10] + 0x10;
          puVar5 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0))
          {
            optional_ptr<duckdb::NestedValidity,_true>::CheckValid
                      ((optional_ptr<duckdb::NestedValidity,_true> *)&local_50);
            NestedValidity::SetInvalid((NestedValidity *)local_50._M_dataplus._M_p,iVar10);
          }
          iVar10 = iVar10 + 1;
        } while (ser_count != iVar10);
      }
    }
  }
  return;
}

Assistant:

void RowOperations::HeapScatterVData(UnifiedVectorFormat &vdata, PhysicalType type, const SelectionVector &sel,
                                     idx_t ser_count, data_ptr_t *key_locations,
                                     optional_ptr<NestedValidity> parent_validity, idx_t offset) {
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedHeapScatter<int8_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT16:
		TemplatedHeapScatter<int16_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT32:
		TemplatedHeapScatter<int32_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT64:
		TemplatedHeapScatter<int64_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT8:
		TemplatedHeapScatter<uint8_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT16:
		TemplatedHeapScatter<uint16_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT32:
		TemplatedHeapScatter<uint32_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT64:
		TemplatedHeapScatter<uint64_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INT128:
		TemplatedHeapScatter<hugeint_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::UINT128:
		TemplatedHeapScatter<uhugeint_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::FLOAT:
		TemplatedHeapScatter<float>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::DOUBLE:
		TemplatedHeapScatter<double>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	case PhysicalType::INTERVAL:
		TemplatedHeapScatter<interval_t>(vdata, sel, ser_count, key_locations, parent_validity, offset);
		break;
	default:
		throw NotImplementedException("FIXME: Serialize to of constant type column to row-format");
	}
}